

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.cpp
# Opt level: O1

int main(void)

{
  Hub h;
  Context local_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  code *local_4a8;
  code *local_4a0;
  Hub local_498;
  
  uWS::Hub::Hub(&local_498,0,false);
  local_4b8 = 0;
  uStack_4b0 = 0;
  local_4a0 = std::
              _Function_handler<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/k0ff33[P]uWebSockets/examples/echo.cpp:7:17)>
              ::_M_invoke;
  local_4a8 = std::
              _Function_handler<void_(uWS::WebSocket<true>,_char_*,_unsigned_long,_uWS::OpCode),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/k0ff33[P]uWebSockets/examples/echo.cpp:7:17)>
              ::_M_manager;
  uWS::Group<true>::onMessage(&local_498.super_Group<true>);
  if (local_4a8 != (code *)0x0) {
    (*local_4a8)(&local_4b8,&local_4b8,3);
  }
  local_4c0.context = (SSL_CTX *)0x0;
  uWS::Hub::listen((int)&local_498,(Context)0xbb8,(int)&local_4c0,(Group *)0x0);
  uS::TLS::Context::~Context(&local_4c0);
  uS::Node::run();
  uWS::Hub::~Hub(&local_498);
  return 0;
}

Assistant:

int main()
{
    uWS::Hub h;

    h.onMessage([](uWS::WebSocket<uWS::SERVER> ws, char *message, size_t length, uWS::OpCode opCode) {
        ws.send(message, length, opCode);
    });

    h.listen(3000);
    h.run();
}